

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_discard_undo(nk_text_undo_state *state)

{
  short sVar1;
  int local_18;
  int i;
  int n;
  nk_text_undo_state *state_local;
  
  if (0 < state->undo_point) {
    if (-1 < state->undo_rec[0].char_storage) {
      sVar1 = state->undo_rec[0].insert_length;
      state->undo_char_point = state->undo_char_point - sVar1;
      nk_memcopy(state->undo_char,state->undo_char + (int)sVar1,(long)state->undo_char_point << 2);
      for (local_18 = 0; local_18 < state->undo_point; local_18 = local_18 + 1) {
        if (-1 < state->undo_rec[local_18].char_storage) {
          state->undo_rec[local_18].char_storage = state->undo_rec[local_18].char_storage - sVar1;
        }
      }
    }
    state->undo_point = state->undo_point + -1;
    nk_memcopy(state,state->undo_rec + 1,(long)state->undo_point * 0xc);
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_discard_undo(struct nk_text_undo_state *state)
{
    /* discard the oldest entry in the undo list */
    if (state->undo_point > 0) {
        /* if the 0th undo state has characters, clean those up */
        if (state->undo_rec[0].char_storage >= 0) {
            int n = state->undo_rec[0].insert_length, i;
            /* delete n characters from all other records */
            state->undo_char_point = (short)(state->undo_char_point - n);
            NK_MEMCPY(state->undo_char, state->undo_char + n,
                (nk_size)state->undo_char_point*sizeof(nk_rune));
            for (i=0; i < state->undo_point; ++i) {
                if (state->undo_rec[i].char_storage >= 0)
                state->undo_rec[i].char_storage = (short)
                    (state->undo_rec[i].char_storage - n);
            }
        }
        --state->undo_point;
        NK_MEMCPY(state->undo_rec, state->undo_rec+1,
            (nk_size)((nk_size)state->undo_point * sizeof(state->undo_rec[0])));
    }
}